

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# neighbor-graph.c
# Opt level: O0

uint32_t mpr_calculate_d_of_y_s
                   (nhdp_domain *domain,neighbor_graph *graph,addr_node *y,avl_tree *subset_s)

{
  list_entity *plVar1;
  oonf_log_source oVar2;
  uint32_t uVar3;
  char *pcVar4;
  undefined8 in_stack_fffffffffffffef0;
  undefined4 uVar5;
  list_entity *__tempptr_2;
  list_entity *__tempptr_1;
  list_entity *__tempptr;
  netaddr_str buf1;
  n1_node *node_n1;
  uint32_t min_cost;
  uint32_t d_x_y;
  avl_tree *subset_s_local;
  addr_node *y_local;
  neighbor_graph *graph_local;
  nhdp_domain *domain_local;
  
  uVar5 = (undefined4)((ulong)in_stack_fffffffffffffef0 >> 0x20);
  node_n1._0_4_ = (*graph->methods->calculate_d1_x_of_n2_addr)(domain,graph,y);
  oVar2 = LOG_MPR;
  if (0xffff00 < (uint)node_n1) {
    node_n1._0_4_ = 0xffffffff;
  }
  if ((log_global_mask[LOG_MPR] & 1) != 0) {
    pcVar4 = netaddr_to_prefixstring((netaddr_str *)((long)&__tempptr + 2),&y->addr,false);
    oonf_log(LOG_SEVERITY_DEBUG,oVar2,"src/nhdp/mpr/neighbor-graph.c",0x121,(void *)0x0,0,
             "mpr_calculate_d_of_y_s(%s)",pcVar4);
    uVar5 = (undefined4)((ulong)pcVar4 >> 0x20);
  }
  if ((log_global_mask[LOG_MPR] & 1) != 0) {
    oonf_log(LOG_SEVERITY_DEBUG,LOG_MPR,"src/nhdp/mpr/neighbor-graph.c",0x122,(void *)0x0,0,
             "initial cost = %u",CONCAT44(uVar5,(uint)node_n1));
  }
  plVar1 = (subset_s->list_head).next;
  while( true ) {
    buf1.buf._54_8_ = &plVar1[-3].prev;
    if (plVar1->prev == (subset_s->list_head).prev) break;
    uVar3 = (*graph->methods->calculate_d_x_y)(domain,graph,(n1_node *)buf1.buf._54_8_,y);
    oVar2 = LOG_MPR;
    if ((log_global_mask[LOG_MPR] & 1) != 0) {
      pcVar4 = netaddr_to_prefixstring
                         ((netaddr_str *)((long)&__tempptr + 2),(netaddr *)buf1.buf._54_8_,false);
      oonf_log(LOG_SEVERITY_DEBUG,oVar2,"src/nhdp/mpr/neighbor-graph.c",0x125,(void *)0x0,0,
               "cost via %s would be = %u",pcVar4,uVar3);
    }
    if (uVar3 < (uint)node_n1) {
      node_n1._0_4_ = uVar3;
    }
    plVar1 = *(list_entity **)(buf1.buf._54_8_ + 0x28);
  }
  return (uint)node_n1;
}

Assistant:

uint32_t
mpr_calculate_d_of_y_s(
  const struct nhdp_domain *domain, struct neighbor_graph *graph, struct addr_node *y, struct avl_tree *subset_s) {
  uint32_t d_x_y, min_cost;
  struct n1_node *node_n1;

#ifdef OONF_LOG_DEBUG_INFO
  struct netaddr_str buf1;
#endif

  /* determine the minimum cost to y over all possible intermediate hops */
  min_cost = graph->methods->calculate_d1_x_of_n2_addr(domain, graph, y);
  if (min_cost > RFC7181_METRIC_MAX) {
    min_cost = RFC7181_METRIC_INFINITE_PATH;
  }
  OONF_DEBUG(LOG_MPR, "mpr_calculate_d_of_y_s(%s)", netaddr_to_string(&buf1, &y->addr));
  OONF_DEBUG(LOG_MPR, "initial cost = %u", min_cost);
  avl_for_each_element(subset_s, node_n1, _avl_node) {
    d_x_y = graph->methods->calculate_d_x_y(domain, graph, node_n1, y);
    OONF_DEBUG(LOG_MPR, "cost via %s would be = %u", netaddr_to_string(&buf1, &node_n1->addr), d_x_y);
    if (d_x_y < min_cost) {
      min_cost = d_x_y;
    }
  }

  return min_cost;
}